

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api_session.cpp
# Opt level: O3

void __thiscall bidfx_public_api::impl::ApiSession::ApiSession(ApiSession *this)

{
  PricingSession *this_00;
  
  (this->super_Session).super_UserInfo._vptr_UserInfo =
       (_func_int **)&PTR_GetHost_abi_cxx11__001e66c0;
  (this->host_)._M_dataplus._M_p = (pointer)&(this->host_).field_2;
  (this->host_)._M_string_length = 0;
  (this->host_).field_2._M_local_buf[0] = '\0';
  (this->username_)._M_dataplus._M_p = (pointer)&(this->username_).field_2;
  (this->username_)._M_string_length = 0;
  (this->username_).field_2._M_local_buf[0] = '\0';
  (this->password_)._M_dataplus._M_p = (pointer)&(this->password_).field_2;
  (this->password_)._M_string_length = 0;
  (this->password_).field_2._M_local_buf[0] = '\0';
  (this->default_account_)._M_dataplus._M_p = (pointer)&(this->default_account_).field_2;
  (this->default_account_)._M_string_length = 0;
  (this->default_account_).field_2._M_local_buf[0] = '\0';
  (this->application_)._M_dataplus._M_p = (pointer)&(this->application_).field_2;
  (this->application_)._M_string_length = 0;
  (this->application_).field_2._M_local_buf[0] = '\0';
  (this->application_version_)._M_dataplus._M_p = (pointer)&(this->application_version_).field_2;
  (this->application_version_)._M_string_length = 0;
  (this->application_version_).field_2._M_local_buf[0] = '\0';
  (this->product_serial_number_)._M_dataplus._M_p = (pointer)&(this->product_serial_number_).field_2
  ;
  (this->product_serial_number_)._M_string_length = 0;
  (this->product_serial_number_).field_2._M_local_buf[0] = '\0';
  this_00 = (PricingSession *)operator_new(0xa8);
  price::PricingSession::PricingSession(this_00,(UserInfo *)this);
  this->pricing_ = &this_00->super_Pricing;
  return;
}

Assistant:

ApiSession::ApiSession()
{
    pricing_ = new PricingSession((BasicUserInfo*) this);
}